

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph-opt.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *__x;
  undefined1 local_270 [8];
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> Arguments;
  ParseResult Result;
  string local_190;
  allocator local_159;
  string local_158;
  undefined1 local_138 [8];
  Options Opts;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  Opts.m_help._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)argv;
  argv_local._0_4_ = argc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"ph-opt",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_190,"Phaeton optimizer command line options",
             (allocator *)
             ((long)&Result.m_sequential.
                     super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cxxopts::Options::Options((Options *)local_138,&local_158,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&Result.m_sequential.
                     super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  createOptions((Options *)local_138);
  parseArgs((ParseResult *)
            &Arguments.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,(Options *)local_138,
            (int *)&argv_local,(char **)Opts.m_help._M_t._M_impl.super__Rb_tree_header._M_node_count
           );
  __x = cxxopts::ParseResult::arguments
                  ((ParseResult *)
                   &Arguments.
                    super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::vector
            ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_270,__x);
  buildJobs((Options *)local_138,
            (ParseResult *)
            &Arguments.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  argv_local._4_4_ = 0;
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_270);
  cxxopts::ParseResult::~ParseResult
            ((ParseResult *)
             &Arguments.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cxxopts::Options::~Options((Options *)local_138);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
  Options Opts(/*argv[0]*/ PH_OPTIMIZER_EXE,
               "Phaeton optimizer command line options");
  createOptions(Opts);
  // Parse input command line arguments.
  auto Result = parseArgs(Opts, argc, argv);
  auto Arguments = Result.arguments();

  buildJobs(Opts, Result);
  return 0;
}